

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O3

Bend * __thiscall OpenMD::SelectionManager::beginSelectedBend(SelectionManager *this,int *i)

{
  pointer pOVar1;
  int iVar2;
  
  pOVar1 = (this->ss_).bitsets_.
           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((**(byte **)&pOVar1[2].bitset_.super__Bvector_base<std::allocator<bool>_> & 1) == 0) {
    iVar2 = OpenMDBitSet::nextOnBit(pOVar1 + 2,0);
    *i = iVar2;
    if (iVar2 == -1) {
      return (Bend *)0x0;
    }
  }
  else {
    *i = 0;
    iVar2 = 0;
  }
  return (this->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
         super__Vector_impl_data._M_start[iVar2];
}

Assistant:

Bend* SelectionManager::beginSelectedBend(int& i) {
#ifdef IS_MPI
    i = 0;
    while (i < static_cast<int>(ss_.bitsets_[BEND].size())) {
      if (ss_.bitsets_[BEND][i]) {
        // check that this processor owns this bend
        if (bends_[i] != NULL) return bends_[i];
      }
      ++i;
    }
    return NULL;
#else
    i = ss_.bitsets_[BEND].firstOnBit();
    return i == -1 ? NULL : bends_[i];
#endif
  }